

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O3

Result __thiscall tonk::SessionOutgoing::PostRecovery(SessionOutgoing *this,int *bytesSentOut)

{
  pthread_mutex_t *__mutex;
  int *piVar1;
  SimpleCipher *this_00;
  uint8_t *data;
  ostringstream *this_01;
  byte bVar2;
  undefined4 uVar3;
  undefined8 *puVar4;
  long lVar5;
  uint16_t uVar6;
  uint16_t uVar7;
  SiameseResult SVar8;
  int iVar9;
  _func_int **pp_Var10;
  OutputWorker *this_02;
  uint8_t *puVar11;
  uint64_t uVar12;
  int *in_RDX;
  uint8_t *puVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  SiameseRecoveryPacket recovery;
  SiameseRecoveryPacket local_1e8;
  uint8_t *local_1d8;
  int iStack_1d0;
  uint8_t *puStack_1c8;
  pthread_mutex_t *ppStack_1c0;
  undefined1 local_1b8 [392];
  
  *in_RDX = 0;
  if ((*(byte *)(bytesSentOut + 0xa9) & 1) == 0) {
    puVar4 = *(undefined8 **)(bytesSentOut + 0x82);
    if (*(int *)(puVar4 + 1) < 4) {
      local_1b8._0_8_ = *puVar4;
      this_01 = (ostringstream *)(local_1b8 + 0x10);
      local_1b8._8_4_ = Warning;
      std::__cxx11::ostringstream::ostringstream(this_01);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_01,(char *)puVar4[7],puVar4[8]);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_01,"PostRecovery ignored before peer address is known",0x31);
      this_02 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(this_02,(LogStringBuffer *)local_1b8);
      std::__cxx11::ostringstream::~ostringstream(this_01);
      std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
    }
  }
  else {
    SVar8 = siamese_encode(*(SiameseEncoder *)(bytesSentOut + 0xb4),&local_1e8);
    uVar16 = local_1e8.DataBytes;
    if (SVar8 == Siamese_Success) {
      __mutex = (pthread_mutex_t *)(bytesSentOut + 2);
      iVar9 = pthread_mutex_lock(__mutex);
      if (iVar9 != 0) {
        std::__throw_system_error(iVar9);
      }
      puVar11 = pktalloc::Allocator::Allocate((Allocator *)(bytesSentOut + 0xc),uVar16 + 0x30);
      pthread_mutex_unlock(__mutex);
      if (puVar11 == (uint8_t *)0x0) {
        pp_Var10 = (_func_int **)operator_new(0x38);
        (this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing = pp_Var10;
        *pp_Var10 = (_func_int *)"Out of memory";
        pp_Var10[1] = (_func_int *)(pp_Var10 + 3);
        pp_Var10[2] = (_func_int *)0x0;
        *(undefined1 *)(pp_Var10 + 3) = 0;
        *(undefined4 *)(pp_Var10 + 5) = 0;
        pp_Var10[6] = (_func_int *)0x10;
        return (Result)(ErrorResult *)this;
      }
      data = puVar11 + 0x10;
      memcpy(data,local_1e8.Data,(ulong)local_1e8.DataBytes);
      bVar2 = *(byte *)(bytesSentOut + 0x1868);
      uVar12 = *(uint64_t *)(bytesSentOut + 0xc4);
      uVar16 = 3;
      *(uint64_t *)(bytesSentOut + 0xc4) = uVar12 + 1;
      if (bVar2 == 1) {
        uVar14 = (int)uVar12 - bytesSentOut[0xbe];
        uVar16 = 0;
        if (uVar14 != 1) {
          uVar16 = 1;
          uVar15 = -uVar14;
          if (0 < (int)uVar14) {
            uVar15 = uVar14;
          }
          if (0x7e < uVar15) {
            uVar16 = 3 - (uVar15 < 0x7fff);
          }
        }
      }
      *(int *)(puVar11 + (ulong)local_1e8.DataBytes + 0x10) = (int)uVar12;
      puVar13 = (uint8_t *)((ulong)uVar16 + (long)(puVar11 + (ulong)local_1e8.DataBytes + 0x10));
      uVar16 = ((uint)bVar2 << 5 | 0x90) + uVar16 * 4;
      if ((*(byte *)(bytesSentOut + 0xb6) & 1) != 0) {
        uVar3 = *(undefined4 *)((long)bytesSentOut + 0x2e1);
        uVar16 = uVar16 | 0x40;
        *(undefined8 *)puVar13 = *(undefined8 *)((long)bytesSentOut + 0x2d9);
        *(undefined4 *)(puVar13 + 8) = uVar3;
        puVar13 = puVar13 + 0xc;
      }
      this_00 = (SimpleCipher *)(bytesSentOut + 0x8a);
      puVar13[3] = (uint8_t)uVar16;
      uVar14 = (int)puVar13 - (int)data;
      security::SimpleCipher::Cipher(this_00,data,local_1e8.DataBytes,uVar12);
      uVar6 = security::SimpleCipher::Tag(this_00,data,uVar14,uVar12);
      iVar9 = uVar14 + 6;
      uVar12 = siamese::GetTimeUsec();
      uVar7 = security::SimpleCipher::TagInt(this_00,uVar16 & 0xff | (int)(uVar12 >> 3) << 8);
      puVar13[2] = (uint8_t)(uVar12 >> 0x13);
      *(short *)puVar13 = (short)(uVar12 >> 3);
      *(uint16_t *)(puVar13 + 4) = uVar7 ^ uVar6;
      local_1d8 = data;
      iStack_1d0 = iVar9;
      puStack_1c8 = puVar11;
      ppStack_1c0 = __mutex;
      (**(code **)(**(long **)(bytesSentOut + 0x84) + 0x10))
                (*(long **)(bytesSentOut + 0x84),bytesSentOut + 0xa2,
                 *(undefined8 *)(bytesSentOut + 0x86));
      lVar5 = *(long *)(bytesSentOut + 0x88);
      LOCK();
      piVar1 = (int *)(lVar5 + 0x18);
      *piVar1 = *piVar1 - iVar9;
      UNLOCK();
      piVar1 = (int *)(lVar5 + 0x58);
      *piVar1 = *piVar1 + iVar9;
      *in_RDX = iVar9;
    }
    else if (SVar8 != Siamese_NeedMoreData) {
      local_1b8._0_8_ = local_1b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,"siamese_encode failed","");
      pp_Var10 = (_func_int **)operator_new(0x38);
      *pp_Var10 = (_func_int *)"SessionOutgoing::PostRecovery";
      pp_Var10[1] = (_func_int *)(pp_Var10 + 3);
      std::__cxx11::string::_M_construct<char*>
                ((string *)(pp_Var10 + 1),local_1b8._0_8_,
                 (char *)(local_1b8._0_8_ + CONCAT44(local_1b8._12_4_,local_1b8._8_4_)));
      *(undefined4 *)(pp_Var10 + 5) = 1;
      (this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing = pp_Var10;
      pp_Var10[6] = (_func_int *)(long)(int)SVar8;
      if ((undefined1 *)local_1b8._0_8_ == local_1b8 + 0x10) {
        return (Result)(ErrorResult *)this;
      }
      operator_delete((void *)local_1b8._0_8_);
      return (Result)(ErrorResult *)this;
    }
  }
  (this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing = (_func_int **)0x0;
  return (Result)(ErrorResult *)this;
}

Assistant:

Result SessionOutgoing::PostRecovery(int& bytesSentOut)
{
    bytesSentOut = 0;

    if (!HasPeerAddress)
    {
        Deps.Logger->Warning("PostRecovery ignored before peer address is known");
        return Result::Success();
    }

    // Generate a recovery packet using the Siamese FEC library.
    // The recovery data is only valid until the next call to siamese_encode()
    SiameseRecoveryPacket recovery;
    const int encodeResult = siamese_encode(FECEncoder, &recovery);

    if (encodeResult == Siamese_NeedMoreData) {
        return Result::Success();
    }

    if (encodeResult != Siamese_Success) {
        return Result("SessionOutgoing::PostRecovery", "siamese_encode failed", ErrorType::Siamese, encodeResult);
    }

    // Allocate space for queued datagram
    OutgoingQueuedDatagram* datagram = (OutgoingQueuedDatagram*)WriteAllocator.Allocate(
        kQueueHeaderBytes + recovery.DataBytes + protocol::kMaxOverheadBytes);
    if (!datagram) {
        return Result::OutOfMemory();
    }

    // No need to call Initialize on the OutgoingQueuedDatagram object

    uint8_t* datagramData = datagram->Data;
    unsigned messageBytes = recovery.DataBytes;

    /*
        This memory allocation and copy cannot be trivially eliminated.
        Hopefully it won't show up on a CPU profiler.

        I started working on it in the Siamese scratch-space branch.
        The problem is that the send timer does not tick fast enough to keep up
        with data rates above 1 MB/s, assuming that Asio completes one send per
        tick.  Tonk must queue up multiple FEC Recovery Datagrams per tick.
    */
    memcpy(datagramData, recovery.Data, messageBytes);

    // The following code must be kept in sync with sendQueuedDatagram().
    // It is inlined and optimized for this common case:

    // No random padding

    uint8_t* footer = datagramData + messageBytes;
    uint8_t flags = protocol::kOnlyFECMask | protocol::kConnectionMask;
    if (ShouldCompressSequenceNumbers) {
        flags |= protocol::kSeqCompMask;
    }

    // No reliable sequence number

    // Write packet nonce to header
    unsigned nonceBytes;
    NonceT nonce = writeNonce(footer, nonceBytes);
    flags |= nonceBytes << 2;
    footer += nonceBytes;

    if (ShouldAttachHandshake)
    {
        flags |= protocol::kHandshakeMask;
        const uint32_t b = siamese::ReadU32_LE(Handshake + 8);
        const uint64_t a = siamese::ReadU64_LE(Handshake);
        siamese::WriteU64_LE(footer, a);
        siamese::WriteU32_LE(footer + 8, b);
        footer += protocol::kHandshakeBytes;
    }

    // Tag checksum includes all the data before the timestamp
    const unsigned taggedBytes = (unsigned)(footer - datagramData);

    // Skip over the timestamp
    uint8_t* timestampData = footer;
    footer += protocol::kTimestampBytes;

    // Write flags
    footer[0] = flags;
    ++footer;

    Encryptor.Cipher(datagramData, messageBytes, nonce);

    // Prepare tag
    uint16_t tag = Encryptor.Tag(datagramData, taggedBytes, nonce);
    static_assert(protocol::kEncryptionTagBytes == 2, "Update this if that changes");
    uint8_t* tagData = footer;

    const unsigned sendBytes = taggedBytes + protocol::kUntaggedDatagramBytes;

    DatagramBuffer datagramBuffer;
    datagramBuffer.AllocatorForFree = &WriteAllocator;
    datagramBuffer.Data = datagramData;
    datagramBuffer.FreePtr = datagram;
    datagramBuffer.Bytes = sendBytes;

    TONK_DEBUG_ASSERT(Deps.UDPSender != nullptr);
    TONK_DEBUG_ASSERT(HasPeerAddress);

#ifdef TONK_DETAILED_STATS
    DetailStats* stats = Deps.Deets->GetWritePtr();
    stats->Stats[Stats_SiameseBytesSent] += messageBytes; // Flags bit means no message frame header
    stats->Stats[Stats_FootersBytesSent] += sendBytes - messageBytes;
#endif // TONK_DETAILED_STATS

    // Write timestamp and final tag - Reduce noise in timestamp measurements
    const uint64_t nowUsec = siamese::GetTimeUsec();
    const uint32_t timestamp24 = (uint32_t)(nowUsec >> kTime23LostBits);
    tag ^= Encryptor.TagInt(protocol::TimestampFlagTagInt(timestamp24, flags));
    siamese::WriteU24_LE(timestampData, timestamp24);
    siamese::WriteU16_LE(tagData, tag);

    // Send the data
    Deps.UDPSender->Send(
        PeerUDPAddress,
        datagramBuffer,
        Deps.ConnectionRef);

    const unsigned kCompressionSavings = 0;
    const bool kNotReliable = false;

    // Update bandwidth control
    Deps.SenderControl->OnSendDatagram(
        kCompressionSavings,
        sendBytes,
        kNotReliable);

    // Report number of bytes sent
    bytesSentOut = static_cast<int>(sendBytes);

#ifdef TONK_ENABLE_VERBOSE_OUTGOING
    ++m_Recovery;
    Deps.Logger->Info("Recovery sent. Current send rate = ", (float)m_Recovery / (float)m_Reliable);
#endif // TONK_ENABLE_VERBOSE_OUTGOING

    return Result::Success();
}